

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KNNValidatorTests.cpp
# Opt level: O1

int testNumberOfNeighborsWithDefaultValueInSet(void)

{
  int iVar1;
  bool bVar2;
  TypeUnion TVar3;
  Int64Parameter *pIVar4;
  Int64Set *pIVar5;
  UniformWeighting *this;
  NearestNeighborsIndex *pNVar6;
  SquaredEuclideanDistance *this_00;
  SingleKdTreeIndex *this_01;
  ostream *poVar7;
  Result res;
  Model m1;
  undefined1 local_70 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  Model local_48;
  
  CoreML::Specification::Model::Model(&local_48);
  CoreML::KNNValidatorTests::generateInterface(&local_48);
  if (local_48._oneof_case_[0] != 0x194) {
    CoreML::Specification::Model::clear_Type(&local_48);
    local_48._oneof_case_[0] = 0x194;
    TVar3.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x48);
    CoreML::Specification::KNearestNeighborsClassifier::KNearestNeighborsClassifier
              (TVar3.knearestneighborsclassifier_);
    local_48.Type_.pipelineclassifier_ = TVar3.pipelineclassifier_;
  }
  TVar3 = local_48.Type_;
  if (*(Int64Parameter **)
       &((local_48.Type_.pipeline_)->models_).super_RepeatedPtrFieldBase.current_size_ ==
      (Int64Parameter *)0x0) {
    pIVar4 = (Int64Parameter *)operator_new(0x28);
    CoreML::Specification::Int64Parameter::Int64Parameter(pIVar4);
    (TVar3.knearestneighborsclassifier_)->numberofneighbors_ = pIVar4;
  }
  pIVar4 = (TVar3.knearestneighborsclassifier_)->numberofneighbors_;
  if (pIVar4->_oneof_case_[0] != 0xb) {
    CoreML::Specification::Int64Parameter::clear_AllowedValues(pIVar4);
    pIVar4->_oneof_case_[0] = 0xb;
    pIVar5 = (Int64Set *)operator_new(0x28);
    CoreML::Specification::Int64Set::Int64Set(pIVar5);
    (pIVar4->AllowedValues_).set_ = pIVar5;
  }
  pIVar5 = (pIVar4->AllowedValues_).set_;
  iVar1 = (pIVar5->values_).total_size_;
  if ((pIVar5->values_).current_size_ == iVar1) {
    google::protobuf::RepeatedField<long>::Reserve(&pIVar5->values_,iVar1 + 1);
  }
  iVar1 = (pIVar5->values_).current_size_;
  (pIVar5->values_).current_size_ = iVar1 + 1;
  ((pIVar5->values_).rep_)->elements[iVar1] = 1;
  if (pIVar4->_oneof_case_[0] != 0xb) {
    CoreML::Specification::Int64Parameter::clear_AllowedValues(pIVar4);
    pIVar4->_oneof_case_[0] = 0xb;
    pIVar5 = (Int64Set *)operator_new(0x28);
    CoreML::Specification::Int64Set::Int64Set(pIVar5);
    (pIVar4->AllowedValues_).set_ = pIVar5;
  }
  pIVar5 = (pIVar4->AllowedValues_).set_;
  iVar1 = (pIVar5->values_).total_size_;
  if ((pIVar5->values_).current_size_ == iVar1) {
    google::protobuf::RepeatedField<long>::Reserve(&pIVar5->values_,iVar1 + 1);
  }
  iVar1 = (pIVar5->values_).current_size_;
  (pIVar5->values_).current_size_ = iVar1 + 1;
  ((pIVar5->values_).rep_)->elements[iVar1] = 4;
  if (pIVar4->_oneof_case_[0] != 0xb) {
    CoreML::Specification::Int64Parameter::clear_AllowedValues(pIVar4);
    pIVar4->_oneof_case_[0] = 0xb;
    pIVar5 = (Int64Set *)operator_new(0x28);
    CoreML::Specification::Int64Set::Int64Set(pIVar5);
    (pIVar4->AllowedValues_).set_ = pIVar5;
  }
  pIVar5 = (pIVar4->AllowedValues_).set_;
  iVar1 = (pIVar5->values_).total_size_;
  if ((pIVar5->values_).current_size_ == iVar1) {
    google::protobuf::RepeatedField<long>::Reserve(&pIVar5->values_,iVar1 + 1);
  }
  iVar1 = (pIVar5->values_).current_size_;
  (pIVar5->values_).current_size_ = iVar1 + 1;
  ((pIVar5->values_).rep_)->elements[iVar1] = 7;
  pIVar4->defaultvalue_ = 4;
  if (((TVar3.supportvectorclassifier_)->rho_).total_size_ != 200) {
    CoreML::Specification::KNearestNeighborsClassifier::clear_WeightingScheme
              (TVar3.knearestneighborsclassifier_);
    ((TVar3.supportvectorclassifier_)->rho_).total_size_ = 200;
    this = (UniformWeighting *)operator_new(0x18);
    CoreML::Specification::UniformWeighting::UniformWeighting(this);
    ((WeightingSchemeUnion *)((DefaultClassLabelUnion *)&(TVar3.pipeline_)->names_ + 1))->
    uniformweighting_ = this;
  }
  if ((NearestNeighborsIndex *)(TVar3.pipelineclassifier_)->pipeline_ ==
      (NearestNeighborsIndex *)0x0) {
    pNVar6 = (NearestNeighborsIndex *)operator_new(0x50);
    CoreML::Specification::NearestNeighborsIndex::NearestNeighborsIndex(pNVar6);
    (TVar3.knearestneighborsclassifier_)->nearestneighborsindex_ = pNVar6;
  }
  pNVar6 = (TVar3.knearestneighborsclassifier_)->nearestneighborsindex_;
  if (pNVar6->_oneof_case_[1] != 200) {
    CoreML::Specification::NearestNeighborsIndex::clear_DistanceFunction(pNVar6);
    pNVar6->_oneof_case_[1] = 200;
    this_00 = (SquaredEuclideanDistance *)operator_new(0x18);
    CoreML::Specification::SquaredEuclideanDistance::SquaredEuclideanDistance(this_00);
    (pNVar6->DistanceFunction_).squaredeuclideandistance_ = this_00;
  }
  if (pNVar6->_oneof_case_[0] != 0x6e) {
    CoreML::Specification::NearestNeighborsIndex::clear_IndexType(pNVar6);
    pNVar6->_oneof_case_[0] = 0x6e;
    this_01 = (SingleKdTreeIndex *)operator_new(0x18);
    CoreML::Specification::SingleKdTreeIndex::SingleKdTreeIndex(this_01);
    (pNVar6->IndexType_).singlekdtreeindex_ = this_01;
  }
  ((pNVar6->IndexType_).linearindex_)->_cached_size_ = 0x1e;
  if ((TVar3.pipeline_)->_cached_size_ != 0x6e) {
    CoreML::Specification::KNearestNeighborsClassifier::clear_DefaultClassLabel
              (TVar3.knearestneighborsclassifier_);
    (TVar3.pipeline_)->_cached_size_ = 0x6e;
    ((DefaultClassLabelUnion *)&(TVar3.pipeline_)->names_)->defaultint64label_ =
         (int64)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  }
  local_70._0_8_ = local_70 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"Default","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&((DefaultClassLabelUnion *)
              &(TVar3.bayesianprobitregressor_)->regressioninputfeaturename_)->defaultstringlabel_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_70);
  if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
    operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
  }
  CoreML::validate<(MLModelType)404>((Result *)local_70,&local_48);
  bVar2 = CoreML::Result::good((Result *)local_70);
  if (!bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
               ,0x6d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1ff);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(res).good()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._8_8_ != &local_58) {
    operator_delete((void *)local_70._8_8_,local_58._0_8_ + 1);
  }
  CoreML::Specification::Model::~Model(&local_48);
  return (uint)!bVar2;
}

Assistant:

int testNumberOfNeighborsWithDefaultValueInSet() {

    Specification::Model m1;

    KNNValidatorTests::generateInterface(m1);

    auto *knnClassifier = m1.mutable_knearestneighborsclassifier();
    auto *numberOfNeighbors = knnClassifier->mutable_numberofneighbors();
    numberOfNeighbors->mutable_set()->add_values(1);
    numberOfNeighbors->mutable_set()->add_values(4);
    numberOfNeighbors->mutable_set()->add_values(7);
    numberOfNeighbors->set_defaultvalue(4);

    knnClassifier->mutable_uniformweighting();

    auto *nnIndex = knnClassifier->mutable_nearestneighborsindex();
    nnIndex->mutable_squaredeuclideandistance();
    auto *kdTree = nnIndex->mutable_singlekdtreeindex();
    kdTree->set_leafsize(30);
    knnClassifier->set_defaultstringlabel("Default");

    Result res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_GOOD(res);

    return 0;

}